

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_zip_set_compression_zstd(archive *_a)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,7,"archive_write_zip_set_compression_zstd");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    if (_a->archive_format == 0x50000) {
      *(undefined4 *)(_a[1].read_data_offset + 0x120) = 0x5d;
      iVar2 = 0;
    }
    else {
      archive_set_error(_a,-1,"Can only use archive_write_zip_set_compression_zstd with zip format")
      ;
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_zip_set_compression_zstd(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	int ret = ARCHIVE_FAILED;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
		ARCHIVE_STATE_NEW | ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
		"archive_write_zip_set_compression_zstd");
	if (a->archive.archive_format != ARCHIVE_FORMAT_ZIP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		"Can only use archive_write_zip_set_compression_zstd"
		" with zip format");
		ret = ARCHIVE_FATAL;
	} else {
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
		struct zip *zip = a->format_data;
		zip->requested_compression = COMPRESSION_ZSTD;
		ret = ARCHIVE_OK;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"zstd compression not supported");
		ret = ARCHIVE_FAILED;
#endif
	}
	return (ret);
}